

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

parser_error parse_profile_room(parser *p)

{
  long *plVar1;
  int iVar2;
  wchar_t wVar3;
  parser_error pVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  anon_struct_24_4_1e7643cc *paVar8;
  long *plVar9;
  
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)((long)pvVar5 + 0x70);
    if (*(long **)((long)pvVar5 + 0x70) == (long *)0x0) {
      plVar9 = (long *)((long)pvVar5 + 0x70);
    }
    else {
      do {
        plVar9 = plVar1;
        plVar1 = (long *)*plVar9;
      } while ((long *)*plVar9 != (long *)0x0);
    }
    pvVar5 = mem_zalloc(0x38);
    *plVar9 = (long)pvVar5;
    pcVar6 = parser_getsym(p,"name");
    pcVar6 = string_make(pcVar6);
    *(char **)((long)pvVar5 + 8) = pcVar6;
    paVar8 = room_builders;
    lVar7 = 0;
    do {
      iVar2 = strcmp(pcVar6,paVar8->name);
      if (iVar2 == 0) goto LAB_001598dc;
      lVar7 = lVar7 + 1;
      paVar8 = paVar8 + 1;
    } while (lVar7 != 0x13);
    lVar7 = 0x13;
LAB_001598dc:
    pVar4 = PARSE_ERROR_NO_ROOM_FOUND;
    if (lVar7 != 0x13) {
      *(room_builder_conflict *)((long)pvVar5 + 0x10) = room_builders[lVar7].builder;
      wVar3 = parser_getint(p,"rating");
      *(wchar_t *)((long)pvVar5 + 0x18) = wVar3;
      wVar3 = parser_getint(p,"height");
      *(wchar_t *)((long)pvVar5 + 0x1c) = wVar3;
      wVar3 = parser_getint(p,"width");
      *(wchar_t *)((long)pvVar5 + 0x20) = wVar3;
      wVar3 = parser_getint(p,"level");
      *(wchar_t *)((long)pvVar5 + 0x24) = wVar3;
      wVar3 = parser_getint(p,"pit");
      *(bool *)((long)pvVar5 + 0x28) = wVar3 == L'\x01';
      wVar3 = parser_getint(p,"rarity");
      *(wchar_t *)((long)pvVar5 + 0x2c) = wVar3;
      wVar3 = parser_getint(p,"cutoff");
      *(wchar_t *)((long)pvVar5 + 0x30) = wVar3;
      pVar4 = PARSE_ERROR_NONE;
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_profile_room(struct parser *p) {
	struct cave_profile *c = parser_priv(p);
	struct room_profile *r = c->room_profiles;
	size_t i;

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	/* Go to the last valid room profile, then allocate a new one */
	if (!r) {
		c->room_profiles = mem_zalloc(sizeof(struct room_profile));
		r = c->room_profiles;
	} else {
		while (r->next)
			r = r->next;
		r->next = mem_zalloc(sizeof(struct room_profile));
		r = r->next;
	}

	/* Now read the data */
	r->name = string_make(parser_getsym(p, "name"));
	for (i = 0; i < N_ELEMENTS(room_builders); i++)
		if (streq(r->name, room_builders[i].name))
			break;

	if (i == N_ELEMENTS(room_builders))
		return PARSE_ERROR_NO_ROOM_FOUND;
	r->builder = room_builders[i].builder;
	r->rating = parser_getint(p, "rating");
	r->height = parser_getint(p, "height");
	r->width = parser_getint(p, "width");
	r->level = parser_getint(p, "level");
	r->pit = (parser_getint(p, "pit") == 1);
	r->rarity = parser_getint(p, "rarity");
	r->cutoff = parser_getint(p, "cutoff");
	return PARSE_ERROR_NONE;
}